

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O1

int h264_mb_qp_delta(bitstream *str,h264_cabac_context *cabac,int32_t *val)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t tmp;
  uint local_20;
  int local_1c [3];
  
  if (cabac != (h264_cabac_context *)0x0) {
    uVar3 = (ulong)cabac->slice->prev_mb_addr;
    if ((uVar3 == 0xffffffff) || (local_1c[0] = 0x3d, cabac->slice->mbs[uVar3].mb_qp_delta == 0)) {
      local_1c[0] = 0x3c;
    }
    local_1c[1] = 0x3e;
    local_1c[2] = 0x3f;
    if (str->dir == VS_ENCODE) {
      iVar1 = *val;
      if (iVar1 < 1) {
        local_20 = iVar1 * -2;
      }
      else {
        local_20 = iVar1 * 2 - 1;
      }
    }
    iVar2 = h264_cabac_tu(str,cabac,local_1c,3,0xffffffff,&local_20);
    iVar1 = 1;
    if (iVar2 == 0) {
      iVar1 = 0;
      if (str->dir == VS_DECODE) {
        uVar4 = local_20 + 1 >> 1;
        if ((local_20 & 1) == 0) {
          uVar4 = -(local_20 >> 1);
        }
        *val = uVar4;
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  iVar1 = vs_se(str,val);
  return iVar1;
}

Assistant:

int h264_mb_qp_delta(struct bitstream *str, struct h264_cabac_context *cabac, int32_t *val) {
	if (!cabac)
		return vs_se(str, val);
	int ctxIdx[3];
	if (cabac->slice->prev_mb_addr != (uint32_t)-1 && cabac->slice->mbs[cabac->slice->prev_mb_addr].mb_qp_delta)
		ctxIdx[0] = H264_CABAC_CTXIDX_MB_QP_DELTA + 1;
	else
		ctxIdx[0] = H264_CABAC_CTXIDX_MB_QP_DELTA + 0;
	ctxIdx[1] = H264_CABAC_CTXIDX_MB_QP_DELTA + 2;
	ctxIdx[2] = H264_CABAC_CTXIDX_MB_QP_DELTA + 3;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
	}
	if (h264_cabac_tu(str, cabac, ctxIdx, 3, -1, &tmp)) return 1;
	if (str->dir == VS_DECODE) {
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
	}
	return 0;
}